

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec3fa __thiscall
embree::XMLLoader::load<embree::Vec3fa>(XMLLoader *this,Ref<embree::XML> *xml,Vec3fa *opt)

{
  float fVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  float *in_RCX;
  long *in_RDX;
  float *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong in_XMM1_Qa;
  Vec3fa VVar6;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 in_stack_ffffffffffffff37;
  Token *in_stack_ffffffffffffff38;
  ParseLocation *in_stack_ffffffffffffff88;
  
  if (*in_RDX == 0) {
    fVar3 = *in_RCX;
    fVar4 = in_RCX[1];
    fVar5 = in_RCX[2];
    fVar1 = in_RCX[3];
    *in_RDI = fVar3;
    in_RDI[1] = fVar4;
    in_RDI[2] = fVar5;
    in_RDI[3] = fVar1;
  }
  else {
    sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                      ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
    if (sVar2 != 3) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff88);
      std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      std::runtime_error::runtime_error((runtime_error *)__lhs,(string *)&stack0xffffffffffffff38);
      __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),0);
    fVar3 = Token::Float(in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),1);
    fVar4 = Token::Float(in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98),2);
    fVar5 = Token::Float(in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
    in_XMM1_Qa = (ulong)(uint)fVar5;
    *in_RDI = fVar3;
    in_RDI[1] = fVar4;
    in_RDI[2] = fVar5;
    in_RDI[3] = 0.0;
  }
  VVar6.field_0.m128[1] = fVar4;
  VVar6.field_0.m128[0] = fVar3;
  VVar6.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa XMLLoader::load<Vec3fa>(const Ref<XML>& xml, const Vec3fa& opt) {
    if (xml == null) return opt;
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }